

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedTests.cpp
# Opt level: O3

int __thiscall glcts::DrawBuffersIndexedTests::init(DrawBuffersIndexedTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TestNode *pTVar1;
  DrawBuffersIndexedColorMasks *this_00;
  DrawBuffersIndexedBlending *this_01;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  DrawBuffersIndexedCoverage::DrawBuffersIndexedCoverage
            ((DrawBuffersIndexedCoverage *)pTVar1,(this->super_TestCaseGroupBase).m_context,
             extParams,"coverage","Basic coverage test");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  DrawBuffersIndexedDefaultState::DrawBuffersIndexedDefaultState
            ((DrawBuffersIndexedDefaultState *)pTVar1,(this->super_TestCaseGroupBase).m_context,
             extParams,"default_state","Default state verification test");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  DrawBuffersIndexedSetGet::DrawBuffersIndexedSetGet
            ((DrawBuffersIndexedSetGet *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "set_get","Setting and getting state test");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (DrawBuffersIndexedColorMasks *)operator_new(0x2b8);
  DrawBuffersIndexedColorMasks::DrawBuffersIndexedColorMasks
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams,"color_masks",
             "Masking color test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (DrawBuffersIndexedBlending *)operator_new(0x2b8);
  DrawBuffersIndexedBlending::DrawBuffersIndexedBlending
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams,"blending","Blending test")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  DrawBuffersIndexedNegative::DrawBuffersIndexedNegative
            ((DrawBuffersIndexedNegative *)pTVar1,(this->super_TestCaseGroupBase).m_context,
             extParams,"negative","Negative test");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void DrawBuffersIndexedTests::init(void)
{
	/* Initialize base class */
	TestCaseGroupBase::init();

	/* Draw Buffers Indexed - 1. Coverage */
	addChild(new DrawBuffersIndexedCoverage(m_context, m_extParams, "coverage", "Basic coverage test"));

	/* Draw Buffers Indexed - 2. Default state */
	addChild(
		new DrawBuffersIndexedDefaultState(m_context, m_extParams, "default_state", "Default state verification test"));

	/* Draw Buffers Indexed - 3. Set and get */
	addChild(new DrawBuffersIndexedSetGet(m_context, m_extParams, "set_get", "Setting and getting state test"));

	/* Draw Buffers Indexed - 4. Color masks */
	addChild(new DrawBuffersIndexedColorMasks(m_context, m_extParams, "color_masks", "Masking color test"));

	/* Draw Buffers Indexed - 5. Blending */
	addChild(new DrawBuffersIndexedBlending(m_context, m_extParams, "blending", "Blending test"));

	/* Draw Buffers Indexed - 6. Negative */
	addChild(new DrawBuffersIndexedNegative(m_context, m_extParams, "negative", "Negative test"));
}